

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

bool verifyResults(int numIterations,uint seed)

{
  anon_class_16_2_20c2ab75 __gen;
  bool bVar1;
  ostream *this;
  uniform_real_distribution<double> *siglen;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  int local_5e5c;
  EVP_PKEY_CTX local_5e58 [4];
  int n;
  double elements [3000];
  undefined1 local_90 [8];
  uniform_real_distribution<double> dist;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_70;
  default_random_engine rnd;
  SvdVerifier<SingularSvd> singularVerifier;
  uint seed_local;
  int numIterations_local;
  
  SvdVerifier<SingularSvd>::SvdVerifier((SvdVerifier<SingularSvd> *)&rnd);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_70,(ulong)seed);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_90,-10.0,10.0);
  for (local_5e5c = 0; local_5e5c < numIterations; local_5e5c = local_5e5c + 1) {
    siglen = (uniform_real_distribution<double> *)local_90;
    __gen.dist = siglen;
    __gen.rnd = &local_70;
    std::generate_n<double*,int,verifyResults(int,unsigned_int)::__0>
              ((double *)local_5e58,3000,__gen);
    SvdVerifier<SingularSvd>::verify
              ((SvdVerifier<SingularSvd> *)&rnd,local_5e58,sig,(size_t)siglen,in_R8,in_R9);
  }
  this = std::operator<<((ostream *)&std::cout,"singular");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  SvdVerifier<SingularSvd>::printStatistics((SvdVerifier<SingularSvd> *)&rnd);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = SvdVerifier<SingularSvd>::isVerified((SvdVerifier<SingularSvd> *)&rnd);
  SvdVerifier<SingularSvd>::~SvdVerifier((SvdVerifier<SingularSvd> *)&rnd);
  return bVar1;
}

Assistant:

bool verifyResults(int numIterations, unsigned int seed) {
	SvdVerifier< SingularSvd > singularVerifier;
#ifdef ENABLE_EIGEN
	SvdVerifier< EigenSvd > eigenVerifier;
#endif
#ifdef ENABLE_ARMADILLO
	SvdVerifier< ArmadilloSvd > armadilloVerifier;
#endif
	std::default_random_engine rnd(seed);
	std::uniform_real_distribution< double > dist(MIN_VALUE, MAX_VALUE);
	double elements[M * N];
	for (int n = 0; n < numIterations; ++n) {
		std::generate_n(elements, M * N, [&rnd, &dist]() {
			return dist(rnd);
		});
		singularVerifier.verify(elements);
#ifdef ENABLE_EIGEN
		eigenVerifier.verify(elements);
		eigenVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
#ifdef ENABLE_ARMADILLO
		armadilloVerifier.verify(elements);
		armadilloVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
	}
	// shows statistics
	std::cout << "singular" << std::endl;
	singularVerifier.printStatistics();
	std::cout << std::endl;
#ifdef ENABLE_EIGEN
	std::cout << "Eigen" << std::endl;
	eigenVerifier.printStatistics();
	std::cout << std::endl;
#endif
#ifdef ENABLE_ARMADILLO
	std::cout << "Armadillo" << std::endl;
	armadilloVerifier.printStatistics();
	std::cout << std::endl;
#endif
	return singularVerifier.isVerified();
}